

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeError(ExpressionContext *ctx,SynError *syntax)

{
  int iVar1;
  undefined4 extraout_var;
  TypeBase *pTVar3;
  ExprBase *pEVar2;
  
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
  pEVar2 = (ExprBase *)CONCAT44(extraout_var,iVar1);
  pTVar3 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
  pEVar2->typeID = 0;
  pEVar2->source = &syntax->super_SynBase;
  pEVar2->type = pTVar3;
  pEVar2->next = (ExprBase *)0x0;
  pEVar2->listed = false;
  pEVar2->_vptr_ExprBase = (_func_int **)&PTR__ExprError_00240b28;
  pEVar2[2]._vptr_ExprBase = (_func_int **)0x0;
  pEVar2[1]._vptr_ExprBase = (_func_int **)&pEVar2[1].source;
  *(undefined8 *)&pEVar2[1].typeID = 0x400000000;
  return pEVar2;
}

Assistant:

ExprBase* AnalyzeError(ExpressionContext &ctx, SynError *syntax)
{
	return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType());
}